

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O0

QPair<int,_QPair<bool,_bool>_> scanDelims(QString *text,int start,bool canSplitWord)

{
  char cVar1;
  bool bVar2;
  qsizetype qVar3;
  byte local_4d;
  byte local_4c;
  byte local_4b;
  byte local_4a;
  byte local_49;
  byte local_48;
  bool local_47;
  bool local_46;
  bool local_45;
  bool local_44;
  bool local_43;
  pair<bool,_bool> local_42;
  bool local_40;
  bool local_3f;
  bool local_3e;
  bool local_3d;
  bool local_3c;
  bool local_3b;
  QChar local_3a;
  bool canClose;
  bool canOpen;
  bool isNextWhiteSpace;
  bool isLastWhiteSpace;
  bool isNextPunct;
  bool isLastPunct;
  QChar nextChar;
  int length;
  byte local_2c;
  byte local_2b;
  QChar local_2a;
  int iStack_28;
  QChar lastChar;
  bool rightFlanking;
  bool leftFlanking;
  QChar marker;
  int textLen;
  int pos;
  bool canSplitWord_local;
  int start_local;
  QString *text_local;
  
  qVar3 = QString::length(text);
  iStack_28 = (int)qVar3;
  local_2a = QString::at(text,(long)start);
  local_2b = 1;
  local_2c = 1;
  _rightFlanking = start;
  if (start < 1) {
    QChar::QChar((QChar *)((long)&length + 2),'\0');
  }
  else {
    length._2_2_ = QString::at(text,(long)(start + -1));
  }
  while( true ) {
    local_43 = false;
    if (_rightFlanking < iStack_28) {
      length._0_2_ = QString::at(text,(long)_rightFlanking);
      nextChar.ucs = local_2a.ucs;
      local_43 = operator==(length._0_2_,local_2a);
    }
    if (local_43 == false) break;
    _rightFlanking = _rightFlanking + 1;
  }
  _canClose = _rightFlanking - start;
  if (_rightFlanking + 1 < iStack_28) {
    local_3a = QString::at(text,(long)_rightFlanking);
  }
  else {
    QChar::QChar(&local_3a,'\0');
  }
  cVar1 = QChar::toLatin1((QChar *)((long)&length + 2));
  bVar2 = isMDAsciiPunct((int)cVar1);
  local_44 = true;
  if (!bVar2) {
    local_44 = QChar::isPunct((QChar *)((long)&length + 2));
  }
  local_3b = local_44;
  cVar1 = QChar::toLatin1(&local_3a);
  bVar2 = isMDAsciiPunct((int)cVar1);
  local_45 = true;
  if (!bVar2) {
    local_45 = QChar::isPunct(&local_3a);
  }
  local_3c = local_45;
  bVar2 = QChar::isNull((QChar *)((long)&length + 2));
  if (bVar2) {
    local_46 = true;
  }
  else {
    local_46 = QChar::isSpace((QChar *)((long)&length + 2));
  }
  local_3d = local_46;
  bVar2 = QChar::isNull(&local_3a);
  if (bVar2) {
    local_47 = true;
  }
  else {
    local_47 = QChar::isSpace(&local_3a);
  }
  local_3e = local_47;
  if (local_47 == false) {
    if ((((local_3c & 1U) != 0) && ((local_3d & 1U) == 0)) && ((local_3b & 1U) == 0)) {
      local_2b = 0;
    }
  }
  else {
    local_2b = 0;
  }
  if ((local_3d & 1U) == 0) {
    if ((((local_3b & 1U) != 0) && (local_47 == false)) && ((local_3c & 1U) == 0)) {
      local_2c = 0;
    }
  }
  else {
    local_2c = 0;
  }
  if (canSplitWord) {
    local_48 = local_2b;
  }
  else {
    local_49 = 0;
    if ((local_2b & 1) != 0) {
      local_4a = 1;
      if ((local_2c & 1) != 0) {
        local_4a = local_3b;
      }
      local_49 = local_4a;
    }
    local_48 = local_49;
  }
  local_3f = (bool)(local_48 & 1);
  if (canSplitWord) {
    local_4b = local_2c;
  }
  else {
    local_4c = 0;
    if ((local_2c & 1) != 0) {
      local_4d = 1;
      if ((local_2b & 1) != 0) {
        local_4d = local_3c;
      }
      local_4c = local_4d;
    }
    local_4b = local_4c;
  }
  local_40 = (bool)(local_4b & 1);
  std::pair<bool,_bool>::pair<bool,_bool,_true>(&local_42,&local_3f,&local_40);
  std::pair<int,_std::pair<bool,_bool>_>::pair<int,_std::pair<bool,_bool>,_true>
            ((pair<int,_std::pair<bool,_bool>_> *)&text_local,(int *)&canClose,&local_42);
  return (QPair<int,_QPair<bool,_bool>_>)text_local;
}

Assistant:

QPair<int, QPair<bool, bool>> scanDelims(const QString &text, const int start,
                                         const bool canSplitWord) {
    int pos = start;
    const int textLen = text.length();
    const QChar marker = text.at(start);
    bool leftFlanking = true;
    bool rightFlanking = true;

    const QChar lastChar = start > 0 ? text.at(start - 1) : QChar('\0');

    while (pos < textLen && text.at(pos) == marker) ++pos;
    const int length = pos - start;

    const QChar nextChar = pos + 1 < textLen ? text.at(pos) : QChar('\0');

    const bool isLastPunct =
        isMDAsciiPunct(lastChar.toLatin1()) || lastChar.isPunct();
    const bool isNextPunct =
        isMDAsciiPunct(nextChar.toLatin1()) || nextChar.isPunct();
    // treat line end and start as whitespace
    const bool isLastWhiteSpace = lastChar.isNull() ? true : lastChar.isSpace();
    const bool isNextWhiteSpace = nextChar.isNull() ? true : nextChar.isSpace();

    if (isNextWhiteSpace) {
        leftFlanking = false;
    } else if (isNextPunct) {
        if (!(isLastWhiteSpace || isLastPunct)) leftFlanking = false;
    }

    if (isLastWhiteSpace) {
        rightFlanking = false;
    } else if (isLastPunct) {
        if (!(isNextWhiteSpace || isNextPunct)) rightFlanking = false;
    }

    //    qDebug () << isNextWhiteSpace << marker;
    //    qDebug () << text << leftFlanking << rightFlanking << lastChar <<
    //    nextChar;

    const bool canOpen = canSplitWord
                             ? leftFlanking
                             : leftFlanking && (!rightFlanking || isLastPunct);
    const bool canClose = canSplitWord
                              ? rightFlanking
                              : rightFlanking && (!leftFlanking || isNextPunct);

    return QPair<int, QPair<bool, bool>>{length, {canOpen, canClose}};
}